

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O0

void deqp::egl::getDefaultFilterLists
               (vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                *lists,FilterList *baseFilters)

{
  char *pcVar1;
  FilterList *pFVar2;
  undefined1 local_190 [8];
  NamedFilterList filters_1;
  NamedFilterList filters;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string name;
  int local_20;
  int stencilRuleNdx;
  int depthRuleNdx;
  int colorRuleNdx;
  FilterList *baseFilters_local;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *lists_local;
  
  for (stencilRuleNdx = 0; stencilRuleNdx < 5; stencilRuleNdx = stencilRuleNdx + 1) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
          name.field_2._12_4_ = name.field_2._12_4_ + 1) {
        pcVar1 = getDefaultFilterLists::s_colorRules[stencilRuleNdx].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar1,&local_c9);
        std::operator+(&local_a8,&local_c8,"_");
        std::operator+(&local_88,&local_a8,getDefaultFilterLists::s_depthRules[local_20].name);
        std::operator+(&local_68,&local_88,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,&local_68,
                       getDefaultFilterLists::s_stencilRules[(int)name.field_2._12_4_].name);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
        pcVar1 = (char *)std::__cxx11::string::c_str();
        NamedFilterList::NamedFilterList
                  ((NamedFilterList *)((long)&filters_1.m_description.field_2 + 8),pcVar1,"");
        pFVar2 = eglu::FilterList::operator<<
                           ((FilterList *)((long)&filters_1.m_description.field_2 + 8),baseFilters);
        pFVar2 = eglu::FilterList::operator<<
                           (pFVar2,getDefaultFilterLists::s_colorRules[stencilRuleNdx].filter);
        pFVar2 = eglu::FilterList::operator<<
                           (pFVar2,getDefaultFilterLists::s_depthRules[local_20].filter);
        pFVar2 = eglu::FilterList::operator<<
                           (pFVar2,getDefaultFilterLists::s_stencilRules[(int)name.field_2._12_4_].
                                   filter);
        eglu::FilterList::operator<<(pFVar2,isConformant);
        std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::
        push_back(lists,(value_type *)((long)&filters_1.m_description.field_2 + 8));
        NamedFilterList::~NamedFilterList
                  ((NamedFilterList *)((long)&filters_1.m_description.field_2 + 8));
        std::__cxx11::string::~string((string *)local_48);
      }
    }
  }
  NamedFilterList::NamedFilterList((NamedFilterList *)local_190,"other","All other configs");
  pFVar2 = eglu::FilterList::operator<<((FilterList *)local_190,baseFilters);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<5,6,5,0>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<8,8,8,0>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<4,4,4,4>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<5,5,5,1>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<8,8,8,8>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,isConformant);
  eglu::FilterList::operator<<(pFVar2,notFloat);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::push_back
            (lists,(value_type *)local_190);
  NamedFilterList::~NamedFilterList((NamedFilterList *)local_190);
  return;
}

Assistant:

void getDefaultFilterLists (vector<NamedFilterList>& lists, const FilterList& baseFilters)
{
	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_colorRules[] =
	{
		{ "rgb565",		colorBits<5, 6, 5, 0> },
		{ "rgb888",		colorBits<8, 8, 8, 0> },
		{ "rgba4444",	colorBits<4, 4, 4, 4> },
		{ "rgba5551",	colorBits<5, 5, 5, 1> },
		{ "rgba8888",	colorBits<8, 8, 8, 8> }
	};

	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_depthRules[] =
	{
		{ "no_depth",	noDepth		},
		{ "depth",		hasDepth	},
	};

	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_stencilRules[] =
	{
		{ "no_stencil",	noStencil	},
		{ "stencil",	hasStencil	},
	};

	for (int colorRuleNdx = 0; colorRuleNdx < DE_LENGTH_OF_ARRAY(s_colorRules); colorRuleNdx++)
	{
		for (int depthRuleNdx = 0; depthRuleNdx < DE_LENGTH_OF_ARRAY(s_depthRules); depthRuleNdx++)
		{
			for (int stencilRuleNdx = 0; stencilRuleNdx < DE_LENGTH_OF_ARRAY(s_stencilRules); stencilRuleNdx++)
			{
				const string		name		= string(s_colorRules[colorRuleNdx].name) + "_" + s_depthRules[depthRuleNdx].name + "_" + s_stencilRules[stencilRuleNdx].name;
				NamedFilterList		filters		(name.c_str(), "");

				filters << baseFilters
						<< s_colorRules[colorRuleNdx].filter
						<< s_depthRules[depthRuleNdx].filter
						<< s_stencilRules[stencilRuleNdx].filter
						<< isConformant;

				lists.push_back(filters);
			}
		}
	}

	// Build "other" set - not configs that don't match any of known color rules
	{
		NamedFilterList		filters		("other", "All other configs");

		// \todo [2014-12-18 pyry] Optimize rules
		filters << baseFilters
				<< notColorBits<5, 6, 5, 0>
				<< notColorBits<8, 8, 8, 0>
				<< notColorBits<4, 4, 4, 4>
				<< notColorBits<5, 5, 5, 1>
				<< notColorBits<8, 8, 8, 8>
				<< isConformant
				<< notFloat;

		lists.push_back(filters);
	}
}